

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kv_instance.cc
# Opt level: O0

void fdb_kvs_find_cmp_name
               (fdb_kvs_handle *handle,char *kvs_name,fdb_custom_cmp_variable *cmp_func_out,
               void **user_param_out)

{
  int iVar1;
  list_elem **pplVar2;
  undefined8 *in_RCX;
  undefined8 *in_RDX;
  char *in_RSI;
  long in_RDI;
  cmp_func_node *cmp_node;
  list_elem *e;
  fdb_file_handle *fhandle;
  list_elem *local_30;
  
  if (*(long *)(*(long *)(in_RDI + 0x28) + 0x10) == 0) {
    *in_RDX = 0;
    *in_RCX = 0;
  }
  else {
    for (local_30 = list_begin(*(list **)(*(long *)(in_RDI + 0x28) + 0x10));
        local_30 != (list_elem *)0x0; local_30 = list_next(local_30)) {
      pplVar2 = &local_30[-2].next;
      if ((in_RSI == (char *)0x0) || (iVar1 = strcmp(in_RSI,default_kvs_name), iVar1 == 0)) {
        if ((*pplVar2 == (list_elem *)0x0) ||
           (iVar1 = strcmp((char *)*pplVar2,default_kvs_name), iVar1 == 0)) {
          *in_RDX = local_30[-1].prev;
          *in_RCX = local_30[-1].next;
          return;
        }
      }
      else if ((*pplVar2 != (list_elem *)0x0) &&
              (iVar1 = strcmp((char *)*pplVar2,in_RSI), iVar1 == 0)) {
        *in_RDX = local_30[-1].prev;
        *in_RCX = local_30[-1].next;
        return;
      }
    }
    *in_RDX = 0;
    *in_RCX = 0;
  }
  return;
}

Assistant:

void fdb_kvs_find_cmp_name(fdb_kvs_handle *handle,
                           char *kvs_name,
                           fdb_custom_cmp_variable* cmp_func_out,
                           void** user_param_out)
{
    fdb_file_handle *fhandle;
    struct list_elem *e;
    struct cmp_func_node *cmp_node;

    fhandle = handle->fhandle;
    if (!fhandle->cmp_func_list) {
        *cmp_func_out = NULL;
        *user_param_out = NULL;
        return;
    }

    e = list_begin(fhandle->cmp_func_list);
    while (e) {
        cmp_node = _get_entry(e, struct cmp_func_node, le);
        if (kvs_name == NULL ||
            !strcmp(kvs_name, default_kvs_name)) {
            if (cmp_node->kvs_name == NULL ||
                !strcmp(cmp_node->kvs_name, default_kvs_name)) { // default KVS
                *cmp_func_out = cmp_node->func;
                *user_param_out = cmp_node->user_param;
                return;
            }
        } else if (cmp_node->kvs_name &&
                   !strcmp(cmp_node->kvs_name, kvs_name)) {
            *cmp_func_out = cmp_node->func;
            *user_param_out = cmp_node->user_param;
            return;
        }
        e = list_next(&cmp_node->le);
    }
    *cmp_func_out = NULL;
    *user_param_out = NULL;
    return;
}